

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwaitcondition_unix.cpp
# Opt level: O0

void __thiscall QWaitCondition::wakeOne(QWaitCondition *this)

{
  int *piVar1;
  long *in_RDI;
  long in_FS_OFFSET;
  int code;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pthread_mutex_lock((pthread_mutex_t *)*in_RDI);
  code = 0;
  qt_report_pthread_error(0,(char *)in_RDI,(char *)0x6d98d6);
  local_c = *(int *)(*in_RDI + 0x5c) + 1;
  piVar1 = qMin<int>(&local_c,(int *)(*in_RDI + 0x58));
  *(int *)(*in_RDI + 0x5c) = *piVar1;
  pthread_cond_signal((pthread_cond_t *)(*in_RDI + 0x28));
  qt_report_pthread_error(code,(char *)in_RDI,(char *)0x6d9925);
  pthread_mutex_unlock((pthread_mutex_t *)*in_RDI);
  qt_report_pthread_error(code,(char *)in_RDI,(char *)0x6d9944);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWaitCondition::wakeOne()
{
    qt_report_pthread_error(pthread_mutex_lock(&d->mutex), "QWaitCondition::wakeOne()",
                            "mutex lock");
    d->wakeups = qMin(d->wakeups + 1, d->waiters);
    qt_report_pthread_error(pthread_cond_signal(&d->cond), "QWaitCondition::wakeOne()",
                            "cv signal");
    qt_report_pthread_error(pthread_mutex_unlock(&d->mutex), "QWaitCondition::wakeOne()",
                            "mutex unlock");
}